

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffucrd(fitsfile *fptr,char *keyname,char *card,int *status)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int tstatus;
  int *in_stack_00000038;
  char *in_stack_00000040;
  fitsfile *in_stack_00000048;
  int *in_stack_000001a0;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  fitsfile *in_stack_000001b8;
  undefined4 local_4;
  
  if (*in_RCX < 1) {
    iVar1 = *in_RCX;
    iVar2 = ffmcrd(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
    if (iVar2 == 0xca) {
      *in_RCX = iVar1;
      ffprec(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffucrd(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           const char *card,   /* I - card string value  */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmcrd(fptr, keyname, card, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffprec(fptr, card, status);
    }
    return(*status);
}